

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgemv_nos(int m,int n,double *a,int lda,double *x,int incx,double *y,int incy)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  double yi;
  double dVar6;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa2,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa3,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa4,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa5,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa6,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa7,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incy < 1) {
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa8,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)m;
  if (m < 1) {
    uVar3 = uVar4;
  }
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    dVar6 = 0.0;
    pdVar1 = x;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dVar6 = dVar6 + a[uVar5] * *pdVar1;
      pdVar1 = pdVar1 + (uint)incx;
    }
    y[uVar4 * (uint)incy] = dVar6;
    a = a + (uint)lda;
  }
  return;
}

Assistant:

void la_dgemv_nos(
        int m, int n,
        const double *a, int lda,
        const double *x, int incx,
        double *y, int incy)
{
    assert(a);
    assert(x);
    assert(y);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);

    for (int i = 0; i < n; i++) {
        double yi = 0.0;
        for (int j = 0; j < m; j++) {
            yi += a[i * lda + j] * x[j * incx];
        }
        y[i * incy] = yi;
    }
}